

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O1

ED * __thiscall ED::drawParticularSegments(ED *this,vector<int,_std::allocator<int>_> *list)

{
  ulong uVar1;
  pointer piVar2;
  int *piVar3;
  int *piVar4;
  undefined8 *in_RDX;
  ulong local_40 [5];
  
  uVar1 = *(ulong *)list[0x10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_40[0] = uVar1 << 0x20 | uVar1 >> 0x20;
  local_40[3] = 0;
  local_40[4] = 0;
  local_40[1] = 0;
  local_40[2] = 0;
  cv::Mat::Mat((Mat *)this,local_40,
               *(uint *)&list[0xd].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish & 0xfff);
  for (piVar3 = (int *)*in_RDX; piVar3 != (int *)in_RDX[1]; piVar3 = piVar3 + 1) {
    piVar2 = (list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    piVar4 = *(int **)(piVar2 + (long)*piVar3 * 6);
    if (piVar4 != *(int **)(piVar2 + (long)*piVar3 * 6 + 2)) {
      do {
        *(undefined1 *)
         ((long)&(((this->segmentPoints).
                   super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>)._M_impl.
                 super__Vector_impl_data +
         (long)*piVar4 + (long)piVar4[1] * **(long **)&this->field_0x48) = 0xff;
        piVar4 = piVar4 + 2;
      } while (piVar4 != *(int **)((list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + (long)*piVar3 * 6 + 2
                                  ));
    }
  }
  return this;
}

Assistant:

Mat ED::drawParticularSegments(std::vector<int> list)
{
	Mat segmentsImage = Mat(edgeImage.size(), edgeImage.type(), Scalar(0));

	std::vector<Point>::iterator it;
	std::vector<int>::iterator itInt;

	for (itInt = list.begin(); itInt != list.end(); itInt++)
		for (it = segmentPoints[*itInt].begin(); it != segmentPoints[*itInt].end(); it++)
			segmentsImage.at<uchar>(*it) = 255;
	
	return segmentsImage;
}